

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O3

void __thiscall
flow::diagnostics::Report::emplace_back(Report *this,Type ty,SourceLocation *sl,string *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_d0;
  SourceLocation local_b0;
  Message local_78;
  
  paVar2 = &local_b0.filename.field_2;
  local_b0.filename._M_dataplus._M_p = (sl->filename)._M_dataplus._M_p;
  paVar1 = &(sl->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.filename._M_dataplus._M_p == paVar1) {
    local_b0.filename.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b0.filename.field_2._8_8_ = *(undefined8 *)((long)&(sl->filename).field_2 + 8);
    local_b0.filename._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b0.filename.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_b0.filename._M_string_length = (sl->filename)._M_string_length;
  (sl->filename)._M_dataplus._M_p = (pointer)paVar1;
  (sl->filename)._M_string_length = 0;
  (sl->filename).field_2._M_local_buf[0] = '\0';
  local_b0.end.column = (sl->end).column;
  local_b0.end.offset = (sl->end).offset;
  local_b0.begin.line = (sl->begin).line;
  local_b0.begin.column = (sl->begin).column;
  local_b0._40_8_ = *(undefined8 *)&(sl->begin).offset;
  local_d0._M_dataplus._M_p = (t->_M_dataplus)._M_p;
  paVar1 = &t->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar1) {
    local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&t->field_2 + 8);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_d0._M_string_length = t->_M_string_length;
  (t->_M_dataplus)._M_p = (pointer)paVar1;
  t->_M_string_length = 0;
  (t->field_2)._M_local_buf[0] = '\0';
  Message::Message(&local_78,ty,&local_b0,&local_d0);
  (*this->_vptr_Report[2])(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.text._M_dataplus._M_p != &local_78.text.field_2) {
    operator_delete(local_78.text._M_dataplus._M_p,local_78.text.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.sourceLocation.filename._M_dataplus._M_p !=
      &local_78.sourceLocation.filename.field_2) {
    operator_delete(local_78.sourceLocation.filename._M_dataplus._M_p,
                    local_78.sourceLocation.filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0.filename._M_dataplus._M_p,
                    local_b0.filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void emplace_back(Type ty, SourceLocation sl, std::string t) {
    push_back(Message(ty, std::move(sl), std::move(t)));
  }